

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::IVertexData::AddVertexMapping(IVertexData *this,uint32_t oldIndex,uint32_t newIndex)

{
  iterator __position;
  mapped_type *dest;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  uint local_28;
  uint32_t local_24;
  
  _local_28 = CONCAT44(oldIndex,newIndex);
  dest = std::
         map<unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>_>_>
         ::operator[](&this->boneAssignmentsMap,&local_28);
  BoneAssignmentsForVertex(this,oldIndex,newIndex,dest);
  this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
            std::
            map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->vertexIndexMapping,&local_24);
  __position._M_current = *(uint **)(this_00 + 8);
  if (__position._M_current == *(uint **)(this_00 + 0x10)) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              (this_00,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
  }
  return;
}

Assistant:

void IVertexData::AddVertexMapping(uint32_t oldIndex, uint32_t newIndex)
{
    BoneAssignmentsForVertex(oldIndex, newIndex, boneAssignmentsMap[newIndex]);
    vertexIndexMapping[oldIndex].push_back(newIndex);
}